

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O2

void UnitTest::CheckEqual<char,char>
               (TestResults *results,char *expected,char *actual,TestDetails *details)

{
  ostream *poVar1;
  char *failure;
  MemoryOutStream stream;
  MemoryOutStream local_1c0;
  
  if (*expected != *actual) {
    MemoryOutStream::MemoryOutStream(&local_1c0);
    poVar1 = std::operator<<((ostream *)&local_1c0,"Expected ");
    poVar1 = std::operator<<(poVar1,*expected);
    poVar1 = std::operator<<(poVar1," but was ");
    std::operator<<(poVar1,*actual);
    failure = MemoryOutStream::GetText(&local_1c0);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream(&local_1c0);
  }
  return;
}

Assistant:

void CheckEqual(TestResults& results, Expected const& expected, Actual const& actual, TestDetails const& details)
{
    if (!(expected == actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}